

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::F_formatter<spdlog::details::null_scoped_padder>::format
          (F_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  size_t sVar1;
  uint uVar2;
  duration duration;
  ulong value;
  int iVar3;
  long lVar4;
  format_decimal_result<char_*> fVar5;
  char local_40 [21];
  char acStack_2b [3];
  char *local_28;
  
  value = (msg->time).__d.__r % 1000000000;
  lVar4 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  uVar2 = (uint)(byte)fmt::v9::detail::do_count_digits(unsigned_long)::bsr2log10[lVar4] -
          (uint)(value < *(ulong *)(fmt::v9::detail::do_count_digits(unsigned_long)::
                                    zero_or_powers_of_10 +
                                   (ulong)(byte)fmt::v9::detail::do_count_digits(unsigned_long)::
                                                bsr2log10[lVar4] * 8));
  if (uVar2 < 9) {
    iVar3 = 9 - uVar2;
    do {
      if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      }
      sVar1 = (dest->super_buffer<char>).size_;
      (dest->super_buffer<char>).size_ = sVar1 + 1;
      (dest->super_buffer<char>).ptr_[sVar1] = '0';
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  fVar5 = fmt::v9::detail::format_decimal<char,unsigned_long>(local_40,value,0x15);
  local_28 = fVar5.begin;
  lVar4 = (long)local_40 - (long)local_28;
  if (-0x16 < lVar4) {
    fmt::v9::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_28,local_28 + lVar4 + 0x15);
    return;
  }
  fmt::v9::detail::assert_fail
            ("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
             ,0x199,"negative value");
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        auto ns = fmt_helper::time_fraction<std::chrono::nanoseconds>(msg.time);
        const size_t field_size = 9;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad9(static_cast<size_t>(ns.count()), dest);
    }